

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t exr_set_name(exr_context_t ctxt,int part_index,char *val)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  exr_priv_part_t p_Var2;
  exr_attribute_t *peVar3;
  exr_attr_string_t *s;
  ulong uVar4;
  exr_result_t eVar5;
  int iVar6;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE_00;
  exr_attribute_t *peVar7;
  size_t __n;
  char *pcVar8;
  exr_context_t nonc;
  ulong uVar9;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  exr_result_t eStackY_60;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  uVar4 = (ulong)(uint)part_index;
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((-1 < part_index) && (part_index < ctxt->num_parts)) {
    if (ctxt->mode == '\x03') {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      UNRECOVERED_JUMPTABLE_00 = ctxt->standard_error;
      eStackY_60 = 0x15;
    }
    else {
      if (ctxt->mode != '\0') {
        p_Var2 = ctxt->parts[uVar4];
        peVar7 = p_Var2->name;
        if (peVar7 == (exr_attribute_t *)0x0) {
          eVar5 = exr_attr_list_add(ctxt,&p_Var2->attributes,"name",EXR_ATTR_STRING,0,
                                    (uint8_t **)0x0,&p_Var2->name);
          peVar7 = p_Var2->name;
        }
        else {
          eVar5 = 0;
          if (peVar7->type != EXR_ATTR_STRING) {
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            eVar5 = (*ctxt->print_error)
                              (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                               p_Var2->name->type_name,"name",ctxt->print_error);
            return eVar5;
          }
        }
        if (val == (char *)0x0) {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          eVar5 = (*ctxt->report_error)(ctxt,3,"Invalid string passed trying to set \'name\'");
          return eVar5;
        }
        __n = strlen(val);
        if (0x7ffffffe < __n) {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          eVar5 = (*ctxt->print_error)
                            (ctxt,3,"String too large to store (%lu bytes) into \'name\'",__n,
                             ctxt->print_error);
          return eVar5;
        }
        if (eVar5 == 0) {
          iVar1 = ctxt->num_parts;
          if (1 < (long)iVar1) {
            for (uVar9 = 0; (long)iVar1 != uVar9; uVar9 = uVar9 + 1) {
              if (uVar4 != uVar9) {
                peVar3 = ctxt->parts[uVar9]->name;
                if (peVar3 == (exr_attribute_t *)0x0) {
                  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                  UNRECOVERED_JUMPTABLE = ctxt->print_error;
                  pcVar8 = "Part %d missing required attribute \'name\' for multi-part file";
                  eVar5 = 3;
                  uVar4 = uVar9;
                  goto LAB_0011897c;
                }
                iVar6 = strcmp(val,((peVar3->field_6).string)->str);
                if (iVar6 == 0) {
                  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                  eVar5 = (*ctxt->print_error)
                                    (ctxt,3,
                                     "Each part should have a unique name, part %d and %d attempting to have same name \'%s\'"
                                     ,uVar9 & 0xffffffff,uVar4,val);
                  return eVar5;
                }
              }
            }
          }
          s = (peVar7->field_6).string;
          if ((s->length == (int)__n) && (0 < s->alloc_size)) {
            memcpy(s->str,val,__n);
            eVar5 = 0;
          }
          else {
            if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
              pthread_mutex_unlock((pthread_mutex_t *)__mutex);
              eVar5 = (*ctxt->print_error)
                                (ctxt,0x14,
                                 "Existing string \'name\' has length %d, requested %d, unable to change"
                                 ,(ulong)((peVar7->field_6).preview)->width,__n & 0xffffffff,
                                 ctxt->print_error);
              return eVar5;
            }
            eVar5 = exr_attr_string_set_with_length(ctxt,s,val,(int)__n);
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return eVar5;
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      UNRECOVERED_JUMPTABLE_00 = ctxt->standard_error;
      eStackY_60 = 8;
    }
    eVar5 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,eStackY_60);
    return eVar5;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  UNRECOVERED_JUMPTABLE = ctxt->print_error;
  pcVar8 = "Part index (%d) out of range";
  eVar5 = 4;
LAB_0011897c:
  eVar5 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar5,pcVar8,uVar4 & 0xffffffff,UNRECOVERED_JUMPTABLE);
  return eVar5;
}

Assistant:

exr_result_t
exr_set_name (exr_context_t ctxt, int part_index, const char* val)
{
    size_t bytes;
    REQ_ATTR_FIND_CREATE (name, EXR_ATTR_STRING);

    /* old library allowed an empty string :(, but ensure not null */
    if (!val)
        return EXR_UNLOCK_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid string passed trying to set 'name'"));

    bytes = strlen (val);

    if (bytes >= (size_t) INT32_MAX)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "String too large to store (%" PRIu64 " bytes) into 'name'",
            (uint64_t) bytes));

    if (rv == EXR_ERR_SUCCESS)
    {
        if (ctxt->num_parts > 1)
        {
            for ( int pidx = 0; pidx < ctxt->num_parts; ++pidx )
            {
                const exr_attribute_t* pname;

                if (pidx == part_index)
                    continue;
                pname = ctxt->parts[pidx]->name;
                if (!pname)
                {
                    return EXR_UNLOCK_AND_RETURN (
                        ctxt->print_error (
                            ctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "Part %d missing required attribute 'name' for multi-part file",
                            pidx));
                }
                if (!strcmp (val, pname->string->str))
                {
                    return EXR_UNLOCK_AND_RETURN (
                        ctxt->print_error (
                            ctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "Each part should have a unique name, part %d and %d attempting to have same name '%s'",
                            pidx, part_index, val));
                }
            }
        }

        if (attr->string->length == (int32_t) bytes &&
            attr->string->alloc_size > 0)
        {
            /* we own the string... */
            memcpy (EXR_CONST_CAST (void*, attr->string->str), val, bytes);
        }
        else if (ctxt->mode != EXR_CONTEXT_WRITE && ctxt->mode != EXR_CONTEXT_TEMPORARY)
        {
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing string 'name' has length %d, requested %d, unable to change",
                attr->string->length,
                (int32_t) bytes));
        }
        else
        {
            rv = exr_attr_string_set_with_length (
                ctxt, attr->string, val, (int32_t) bytes);
        }
    }

    return EXR_UNLOCK_AND_RETURN (rv);
}